

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void glcts::anon_unknown_0::ShaderSourceFactory::streamUniformDefinitions
               (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                *uniforms,GLenum shader,ostringstream *ret)

{
  bool bVar1;
  ostream *poVar2;
  pointer pUVar3;
  size_t child;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  for (uVar6 = 0;
      pUVar3 = (uniforms->
               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)(((long)(uniforms->
                             super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3) / 0x1d8);
      uVar6 = uVar6 + 1) {
    bVar1 = DefOccurence::occurs(&pUVar3[uVar6].declOccurence,shader);
    if (bVar1) {
      pUVar3 = (uniforms->
               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pUVar3[uVar6].type.baseType == 0) {
        poVar2 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"struct ")
        ;
        poVar2 = std::operator<<(poVar2,(string *)
                                        &(uniforms->
                                         super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar6].type.
                                         strType);
        poVar2 = std::operator<<(poVar2," {");
        std::endl<char,std::char_traits<char>>(poVar2);
        lVar5 = 0;
        for (uVar4 = 0;
            pUVar3 = (uniforms->
                     super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                     )._M_impl.super__Vector_impl_data._M_start,
            uVar4 < (ulong)(((long)*(pointer *)
                                    ((long)&pUVar3[uVar6].childUniforms.
                                            super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                            ._M_impl + 8) -
                            *(long *)&pUVar3[uVar6].childUniforms.
                                      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                      ._M_impl) / 0x1d8) / (ulong)(long)pUVar3[uVar6].type.arraySize
            ; uVar4 = uVar4 + 1) {
          std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"    ");
          anon_unknown_0::Uniform::streamDefinition
                    ((Uniform *)
                     (*(long *)&(uniforms->
                                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar6].childUniforms.
                                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                ._M_impl + lVar5),ret);
          poVar2 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,";");
          std::endl<char,std::char_traits<char>>(poVar2);
          lVar5 = lVar5 + 0x1d8;
        }
        poVar2 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"};");
        std::endl<char,std::char_traits<char>>(poVar2);
        pUVar3 = (uniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::streamDefinition
                (&pUVar3[uVar6].location,ret,shader);
      std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"uniform ");
      anon_unknown_0::Uniform::streamDefinition
                ((uniforms->
                 super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar6,ret);
      poVar2 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,";");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  return;
}

Assistant:

static void streamUniformDefinitions(const std::vector<Uniform>& uniforms, GLenum shader, std::ostringstream& ret)
	{
		for (size_t i = 0; i < uniforms.size(); i++)
		{
			if (uniforms[i].declOccurence.occurs(shader))
			{
				if (uniforms[i].type.isStruct())
				{
					ret << "struct " << uniforms[i].type.str() << " {" << std::endl;
					for (size_t child = 0; child < uniforms[i].childUniforms.size() / uniforms[i].type.arraySize;
						 child++)
					{
						ret << "    ";
						uniforms[i].childUniforms[child].streamDefinition(ret);
						ret << ";" << std::endl;
					}
					ret << "};" << std::endl;
				}
				uniforms[i].location.streamDefinition(ret, shader);
				ret << "uniform ";
				uniforms[i].streamDefinition(ret);
				ret << ";" << std::endl;
			}
		}
	}